

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

PaUtilAllocationGroupLink *
AllocateLinks(long count,PaUtilAllocationGroupLink *nextBlock,PaUtilAllocationGroupLink *nextSpare)

{
  PaUtilAllocationGroupLink *pPVar1;
  int local_2c;
  int i;
  PaUtilAllocationGroupLink *result;
  PaUtilAllocationGroupLink *nextSpare_local;
  PaUtilAllocationGroupLink *nextBlock_local;
  long count_local;
  
  pPVar1 = (PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(count << 4);
  if (pPVar1 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1->buffer = pPVar1;
    pPVar1->next = nextBlock;
    for (local_2c = 1; local_2c < count; local_2c = local_2c + 1) {
      pPVar1[local_2c].buffer = (void *)0x0;
      pPVar1[local_2c].next = pPVar1 + (local_2c + 1);
    }
    pPVar1[count + -1].next = nextSpare;
  }
  return pPVar1;
}

Assistant:

static struct PaUtilAllocationGroupLink *AllocateLinks( long count,
        struct PaUtilAllocationGroupLink *nextBlock,
        struct PaUtilAllocationGroupLink *nextSpare )
{
    struct PaUtilAllocationGroupLink *result;
    int i;

    result = (struct PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(
            sizeof(struct PaUtilAllocationGroupLink) * count );
    if( result )
    {
        /* the block link */
        result[0].buffer = result;
        result[0].next = nextBlock;

        /* the spare links */
        for( i=1; i<count; ++i )
        {
            result[i].buffer = 0;
            result[i].next = &result[i+1];
        }
        result[count-1].next = nextSpare;
    }

    return result;
}